

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O0

Polygon * __thiscall Polygon::ConvexHull(Polygon *__return_storage_ptr__,Polygon *this)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pPVar4;
  Point local_b0;
  Point candidateHullPoint;
  const_iterator __end2;
  const_iterator __begin2;
  list<Point,_std::allocator<Point>_> *__range2;
  _List_node_base *local_88;
  _List_node_base *local_80;
  _List_const_iterator<Point> local_78;
  _List_const_iterator<Point> local_70;
  _List_const_iterator<Point> NextHullPointIt;
  Point local_54;
  Point nextHullPoint;
  Point currentHullPoint;
  Point point;
  const_iterator __end1;
  const_iterator __begin1;
  list<Point,_std::allocator<Point>_> *__range1;
  Point leftmostPoint;
  Polygon *this_local;
  Polygon *convexHull;
  
  leftmostPoint = (Point)this;
  sVar2 = std::__cxx11::list<Point,_std::allocator<Point>_>::size(&this->mPoints);
  if (sVar2 < 3) {
    memset(__return_storage_ptr__,0,0x18);
    Polygon(__return_storage_ptr__);
  }
  else {
    pvVar3 = std::__cxx11::list<Point,_std::allocator<Point>_>::front(&this->mPoints);
    __range1 = *(list<Point,_std::allocator<Point>_> **)pvVar3;
    __end1 = std::__cxx11::list<Point,_std::allocator<Point>_>::begin(&this->mPoints);
    point = (Point)std::__cxx11::list<Point,_std::allocator<Point>_>::end(&this->mPoints);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&point), bVar1) {
      pPVar4 = std::_List_const_iterator<Point>::operator*(&__end1);
      unique0x00012000 = *pPVar4;
      bVar1 = Point::IsOnTheLeftOf((Point *)&currentHullPoint.mY,(Point *)&__range1);
      if (bVar1) {
        __range1 = (list<Point,_std::allocator<Point>_> *)stack0xffffffffffffffc0;
      }
      std::_List_const_iterator<Point>::operator++(&__end1);
    }
    currentHullPoint.mX._3_1_ = 0;
    Polygon(__return_storage_ptr__);
    nextHullPoint = (Point)__range1;
    do {
      Point::Point(&local_54);
      std::__cxx11::list<Point,_std::allocator<Point>_>::push_back
                (&__return_storage_ptr__->mPoints,&nextHullPoint);
      local_78._M_node =
           (_List_node_base *)
           std::__cxx11::list<Point,_std::allocator<Point>_>::begin(&this->mPoints);
      local_80 = (_List_node_base *)
                 std::__cxx11::list<Point,_std::allocator<Point>_>::end(&this->mPoints);
      local_70 = std::find<std::_List_const_iterator<Point>,Point>
                           (local_78,(_List_const_iterator<Point>)local_80,&nextHullPoint);
      local_88 = (_List_node_base *)std::_List_const_iterator<Point>::operator++(&local_70,0);
      __range2 = (list<Point,_std::allocator<Point>_> *)
                 std::__cxx11::list<Point,_std::allocator<Point>_>::end(&this->mPoints);
      bVar1 = std::operator!=(&local_70,(_Self *)&__range2);
      if (bVar1) {
        pPVar4 = std::_List_const_iterator<Point>::operator*(&local_70);
        local_54 = *pPVar4;
      }
      else {
        pvVar3 = std::__cxx11::list<Point,_std::allocator<Point>_>::front(&this->mPoints);
        local_54.mX = pvVar3->mX;
        local_54.mY = pvVar3->mY;
      }
      __end2 = std::__cxx11::list<Point,_std::allocator<Point>_>::begin(&this->mPoints);
      candidateHullPoint =
           (Point)std::__cxx11::list<Point,_std::allocator<Point>_>::end(&this->mPoints);
      while (bVar1 = std::operator!=(&__end2,(_Self *)&candidateHullPoint), bVar1) {
        pPVar4 = std::_List_const_iterator<Point>::operator*(&__end2);
        local_b0 = *pPVar4;
        bVar1 = Point::IsOnTheLeftOf(&local_b0,&nextHullPoint,&local_54);
        if (bVar1) {
          local_54 = local_b0;
        }
        std::_List_const_iterator<Point>::operator++(&__end2);
      }
      nextHullPoint = local_54;
      bVar1 = operator!=(&nextHullPoint,(Point *)&__range1);
    } while (bVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

Polygon Polygon::ConvexHull() const
{
    // Gift-wrapping algorithm
    if(mPoints.size() < 3)
    {
        return Polygon();
    }
    Point leftmostPoint = mPoints.front();
    for(auto point : mPoints)
    {
        if(point.IsOnTheLeftOf(leftmostPoint))
        {
            leftmostPoint = point;
        }
    }
    Polygon convexHull;
    Point currentHullPoint = leftmostPoint;
    do
    {
        Point nextHullPoint;
        convexHull.mPoints.push_back(currentHullPoint);
        auto NextHullPointIt = std::find(mPoints.begin(), mPoints.end(), currentHullPoint);
        NextHullPointIt++;
        if(NextHullPointIt != mPoints.end())
        {
            nextHullPoint = *(NextHullPointIt);
        }
        else
        {
            nextHullPoint = mPoints.front();
        }
        for(auto candidateHullPoint : mPoints)
        {
            if(candidateHullPoint.IsOnTheLeftOf(currentHullPoint, nextHullPoint))
            {
                nextHullPoint = candidateHullPoint;
            }
        }
        currentHullPoint = nextHullPoint;
    } while(currentHullPoint != leftmostPoint);
    return convexHull;
}